

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompressedStorage.h
# Opt level: O1

void __thiscall
Eigen::internal::CompressedStorage<double,_int>::reserve
          (CompressedStorage<double,_int> *this,Index size)

{
  Scalar *pSVar1;
  StorageIndex *pSVar2;
  Scalar *__dest;
  StorageIndex *__dest_00;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = this->m_size;
  uVar3 = size + uVar4;
  if (this->m_allocatedSize < (long)uVar3) {
    __dest = (Scalar *)operator_new__(-(ulong)(uVar3 >> 0x3d != 0) | uVar3 * 8);
    __dest_00 = (StorageIndex *)operator_new__(-(ulong)(uVar3 >> 0x3e != 0) | uVar3 * 4);
    if ((long)uVar3 <= (long)uVar4) {
      uVar4 = uVar3;
    }
    if (0 < (long)uVar4) {
      memcpy(__dest,this->m_values,uVar4 * 8);
      memcpy(__dest_00,this->m_indices,uVar4 << 2);
    }
    pSVar1 = this->m_values;
    pSVar2 = this->m_indices;
    this->m_values = __dest;
    this->m_indices = __dest_00;
    this->m_allocatedSize = uVar3;
    if (pSVar2 != (StorageIndex *)0x0) {
      operator_delete__(pSVar2);
    }
    if (pSVar1 != (Scalar *)0x0) {
      operator_delete__(pSVar1);
      return;
    }
  }
  return;
}

Assistant:

void reserve(Index size)
    {
      Index newAllocatedSize = m_size + size;
      if (newAllocatedSize > m_allocatedSize)
        reallocate(newAllocatedSize);
    }